

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O1

void __thiscall
leveldb::MemTable::Add(MemTable *this,SequenceNumber s,ValueType type,Slice *key,Slice *value)

{
  size_t __n;
  uint64_t v;
  ulong uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ulong bytes;
  char *buf;
  char *local_50;
  uint64_t local_48;
  Slice *local_40;
  Slice *local_38;
  
  __n = key->size_;
  v = value->size_;
  local_48 = __n + 8;
  local_40 = key;
  local_38 = value;
  iVar2 = VarintLength(local_48);
  iVar3 = VarintLength(v);
  bytes = v + __n + 8 + (long)iVar2 + (long)iVar3;
  if (bytes == 0) {
    __assert_fail("bytes > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/arena.h"
                  ,0x3b,"char *leveldb::Arena::Allocate(size_t)");
  }
  uVar1 = (this->arena_).alloc_bytes_remaining_;
  if (uVar1 < bytes) {
    local_50 = Arena::AllocateFallback(&this->arena_,bytes);
  }
  else {
    local_50 = (this->arena_).alloc_ptr_;
    (this->arena_).alloc_ptr_ = local_50 + bytes;
    (this->arena_).alloc_bytes_remaining_ = uVar1 - bytes;
  }
  pcVar4 = EncodeVarint32(local_50,(uint32_t)local_48);
  memcpy(pcVar4,local_40->data_,__n);
  *(ulong *)(pcVar4 + __n) = (ulong)type | s << 8;
  pcVar4 = EncodeVarint32((char *)((long)(pcVar4 + __n) + 8),(uint32_t)v);
  memcpy(pcVar4,local_38->data_,v);
  if (pcVar4 + v == local_50 + bytes) {
    SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Insert(&this->table_,&local_50);
    return;
  }
  __assert_fail("p + val_size == buf + encoded_len",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/memtable.cc"
                ,0x61,
                "void leveldb::MemTable::Add(SequenceNumber, ValueType, const Slice &, const Slice &)"
               );
}

Assistant:

void MemTable::Add(SequenceNumber s, ValueType type, const Slice& key,
                   const Slice& value) {
  // Format of an entry is concatenation of:
  //  key_size     : varint32 of internal_key.size()
  //  key bytes    : char[internal_key.size()]
  //  value_size   : varint32 of value.size()
  //  value bytes  : char[value.size()]
  size_t key_size = key.size();
  size_t val_size = value.size();
  size_t internal_key_size = key_size + 8;
  const size_t encoded_len = VarintLength(internal_key_size) +
                             internal_key_size + VarintLength(val_size) +
                             val_size;
  char* buf = arena_.Allocate(encoded_len);
  char* p = EncodeVarint32(buf, internal_key_size);
  memcpy(p, key.data(), key_size);
  p += key_size;
  EncodeFixed64(p, (s << 8) | type);
  p += 8;
  p = EncodeVarint32(p, val_size);
  memcpy(p, value.data(), val_size);
  assert(p + val_size == buf + encoded_len);
  table_.Insert(buf);
}